

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateSGD(ValidationContext *this)

{
  uint *puVar1;
  uint *args_4;
  ktx_uint64_t kVar2;
  __array _Var3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  ulong uVar4;
  uint32_t level;
  uint32_t uVar5;
  pointer pkVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint32_t imageCount;
  __array buffer;
  ktx_uint64_t sgdByteLength;
  long local_40;
  uint64_t expectedBgdByteLength;
  
  kVar2 = (this->header).supercompressionGlobalData.byteOffset;
  uVar11 = (this->header).supercompressionGlobalData.byteLength;
  if (uVar11 != 0 && kVar2 != 0) {
    sgdByteLength = uVar11;
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(uVar11);
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar11);
    buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (*this->_vptr_ValidationContext[2])
              (this,kVar2,
               __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar11,7,"the SGD");
    _Var3._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if ((this->header).supercompressionScheme == 1) {
      imageCount = 0;
      for (uVar5 = 0; this->numLevels != uVar5; uVar5 = uVar5 + 1) {
        uVar9 = (this->header).pixelDepth >> ((byte)uVar5 & 0x1f);
        imageCount = imageCount +
                     (uVar9 + (uVar9 == 0)) * (this->header).faceCount * this->numLayers;
      }
      if (sgdByteLength < 0x14) {
        error<unsigned_long_const&>(this,&SGD::BLZESizeTooSmallHeader,&sgdByteLength);
      }
      else {
        expectedBgdByteLength =
             (ulong)imageCount * 0x14 +
             (ulong)*(uint *)((long)buffer._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8)
             + (ulong)*(uint *)((long)buffer._M_t.
                                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                               0x10) +
             (ulong)*(uint *)((long)buffer._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4)
             + (ulong)*(uint *)((long)buffer._M_t.
                                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                               0xc) + 0x14;
        if (sgdByteLength != expectedBgdByteLength) {
          error<unsigned_long_const&,unsigned_int&,unsigned_long_const&>
                    (this,&SGD::BLZESizeIncorrect,&sgdByteLength,&imageCount,&expectedBgdByteLength)
          ;
        }
        if ((((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_engaged == true) &&
            ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
             super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value == KHR_DF_MODEL_ETC1S
            )) && (*(uint *)((long)_Var3._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            0x10) != 0)) {
          error<unsigned_int_const&>
                    (this,&SGD::BLZEExtendedByteLengthNotZero,
                     (uint *)((long)_Var3._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             0x10));
        }
        if ((ulong)imageCount * 0x14 + 0x14 <= sgdByteLength) {
          local_40 = (long)buffer._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x14;
          bVar10 = 0;
          uVar11 = 0;
          for (uVar9 = 0; local_64 = uVar9, uVar9 < this->numLevels; uVar9 = uVar9 + 1) {
            for (local_58 = 0; local_58 < this->numLayers; local_58 = local_58 + 1) {
              for (local_5c = 0; local_5c < (this->header).faceCount; local_5c = local_5c + 1) {
                for (local_60 = 0; uVar7 = (this->header).pixelDepth >> ((byte)uVar9 & 0x1f),
                    local_60 < uVar7 + (uVar7 == 0); local_60 = local_60 + 1) {
                  args_4 = (uint *)(local_40 + uVar11 * 0x14);
                  uVar9 = *(uint *)(local_40 + uVar11 * 0x14);
                  if ((uVar9 & 0xfffffffd) != 0) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this,&SGD::BLZEInvalidImageFlagBit,&local_64,&local_58,&local_5c,
                               &local_60,args_4);
                  }
                  puVar1 = args_4 + 2;
                  uVar7 = args_4[2];
                  if (uVar7 == 0) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this,&SGD::BLZEZeroRGBLength,&local_64,&local_58,&local_5c,&local_60,
                               puVar1);
                    uVar7 = *puVar1;
                  }
                  uVar4 = (ulong)local_64;
                  pkVar6 = (this->levelIndices).
                           super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar8 = pkVar6[uVar4].byteLength;
                  if (uVar8 < uVar7 + args_4[1]) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                              (this,&SGD::BLZEInvalidRGBSlice,&local_64,&local_58,&local_5c,
                               &local_60,args_4 + 1,puVar1,&pkVar6[uVar4].byteLength);
                    uVar4 = (ulong)local_64;
                    pkVar6 = (this->levelIndices).
                             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar8 = pkVar6[uVar4].byteLength;
                  }
                  puVar1 = args_4 + 4;
                  uVar7 = args_4[4];
                  if (uVar8 < args_4[3] + uVar7) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                              (this,&SGD::BLZEInvalidAlphaSlice,&local_64,&local_58,&local_5c,
                               &local_60,args_4 + 3,puVar1,&pkVar6[uVar4].byteLength);
                    uVar7 = *puVar1;
                  }
                  uVar5 = this->numSamples;
                  if (uVar5 == 2 && uVar7 == 0) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&>
                              (this,&SGD::BLZEDFDMismatchAlpha,&local_64,&local_58,&local_5c,
                               &local_60);
                    uVar7 = *puVar1;
                    uVar5 = this->numSamples;
                  }
                  if ((uVar7 != 0) && (uVar5 == 1)) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this,&SGD::BLZEDFDMismatchNoAlpha,&local_64,&local_58,&local_5c,
                               &local_60,puVar1);
                  }
                  bVar10 = (byte)((uVar9 & 2) >> 1) | bVar10;
                  uVar11 = (ulong)((int)uVar11 + 1);
                  uVar9 = local_64;
                }
              }
            }
          }
          if ((bVar10 != 0) && (this->foundKTXanimData == false)) {
            error<>(this,&SGD::BLZENoAnimationSequencesPFrame);
          }
        }
      }
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buffer);
  }
  return;
}

Assistant:

void ValidationContext::validateSGD() {
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    if (sgdByteOffset == 0 || sgdByteLength == 0)
        return; // There is no SGD block

    const auto buffer = std::make_unique<uint8_t[]>(sgdByteLength);
    read(sgdByteOffset, buffer.get(), sgdByteLength, "the SGD");

    if (header.supercompressionScheme != KTX_SS_BASIS_LZ)
        return;

    // Validate BASIS_LZ SGD

    uint32_t imageCount = 0;
    // uint32_t layersFaces = numLayers * header.faceCount;
    for (uint32_t level = 0; level < numLevels; ++level)
        // numFaces * depth is only reasonable because they can't both be > 1. There are no 3D cubemaps
        imageCount += numLayers * header.faceCount * std::max(header.pixelDepth >> level, 1u);

    // Validate GlobalHeader
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader)) {
        error(SGD::BLZESizeTooSmallHeader, sgdByteLength);
        return;
    }

    const ktxBasisLzGlobalHeader& bgh = *reinterpret_cast<const ktxBasisLzGlobalHeader*>(buffer.get());

    const uint64_t expectedBgdByteLength =
            sizeof(ktxBasisLzGlobalHeader) +
            sizeof(ktxBasisLzEtc1sImageDesc) * imageCount +
            bgh.endpointsByteLength +
            bgh.selectorsByteLength +
            bgh.tablesByteLength +
            bgh.extendedByteLength;
    if (sgdByteLength != expectedBgdByteLength)
        error(SGD::BLZESizeIncorrect, sgdByteLength, imageCount, expectedBgdByteLength);

    if (parsedColorModel && *parsedColorModel == KHR_DF_MODEL_ETC1S && bgh.extendedByteLength != 0)
        error(SGD::BLZEExtendedByteLengthNotZero, bgh.extendedByteLength);

    // Validate ImageDesc
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader) + sizeof(ktxBasisLzEtc1sImageDesc) * imageCount)
        return;

    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(buffer.get());

    bool foundPFrame = false;
    uint32_t i = 0;
    for (uint32_t level = 0; level < numLevels; ++level) {
        for (uint32_t layer = 0; layer < numLayers; ++layer) {
            for (uint32_t face = 0; face < header.faceCount; ++face) {
                for (uint32_t zSlice = 0; zSlice < std::max(header.pixelDepth >> level, 1u); ++zSlice) {
                    const auto imageIndex = i++;
                    const auto& image = imageDescs[imageIndex];

                    if (image.imageFlags & ETC1S_P_FRAME)
                        foundPFrame = true;

                    if (image.imageFlags & ~ETC1S_P_FRAME)
                        error(SGD::BLZEInvalidImageFlagBit, level, layer, face, zSlice, image.imageFlags);

                    if (image.rgbSliceByteLength == 0)
                        error(SGD::BLZEZeroRGBLength, level, layer, face, zSlice, image.rgbSliceByteLength);

                    if (image.rgbSliceByteOffset + image.rgbSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidRGBSlice, level, layer, face, zSlice, image.rgbSliceByteOffset, image.rgbSliceByteLength, levelIndices[level].byteLength);
                    if (image.alphaSliceByteOffset + image.alphaSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidAlphaSlice, level, layer, face, zSlice, image.alphaSliceByteOffset, image.alphaSliceByteLength, levelIndices[level].byteLength);

                    // Crosscheck with the DFD numSamples
                    if (image.alphaSliceByteLength == 0 && numSamples == 2)
                        error(SGD::BLZEDFDMismatchAlpha, level, layer, face, zSlice);
                    if (image.alphaSliceByteLength != 0 && numSamples == 1)
                        error(SGD::BLZEDFDMismatchNoAlpha, level, layer, face, zSlice, image.alphaSliceByteLength);
                }
            }
        }
    }

    if (foundPFrame)
        if (!foundKTXanimData)
            error(SGD::BLZENoAnimationSequencesPFrame);
}